

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utest.cpp
# Opt level: O0

void __thiscall
UtestShell::runOneTestInCurrentProcess(UtestShell *this,TestPlugin *plugin,TestResult *result)

{
  int iVar1;
  UtestShell *test;
  TestResult *result_00;
  undefined4 extraout_var;
  TestResult *in_RDX;
  long *in_RSI;
  UtestShell *in_RDI;
  Utest *testToRun;
  TestResult *savedResult;
  UtestShell *savedTest;
  
  (*in_RDX->_vptr_TestResult[0xf])(in_RDX,"\n-- before runAllPreTestAction: ");
  (**(code **)(*in_RSI + 0x28))(in_RSI,in_RDI,in_RDX);
  (*in_RDX->_vptr_TestResult[0xf])(in_RDX,"\n-- after runAllPreTestAction: ");
  test = getCurrent();
  result_00 = getTestResult(in_RDI);
  setTestResult(in_RDI,in_RDX);
  setCurrentTest(in_RDI,in_RDI);
  (*in_RDX->_vptr_TestResult[0xf])(in_RDX,"\n---- before createTest: ");
  iVar1 = (*in_RDI->_vptr_UtestShell[0x22])();
  (*in_RDX->_vptr_TestResult[0xf])(in_RDX,"\n---- after createTest: ");
  (*in_RDX->_vptr_TestResult[0xf])(in_RDX,"\n------ before runTest: ");
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x10))();
  (*in_RDX->_vptr_TestResult[0xf])(in_RDX,"\n------ after runTest: ");
  setCurrentTest(in_RDI,test);
  setTestResult(in_RDI,result_00);
  (*in_RDX->_vptr_TestResult[0xf])(in_RDX,"\n---- before destroyTest: ");
  (*in_RDI->_vptr_UtestShell[0x23])(in_RDI,(long *)CONCAT44(extraout_var,iVar1));
  (*in_RDX->_vptr_TestResult[0xf])(in_RDX,"\n---- after destroyTest: ");
  (*in_RDX->_vptr_TestResult[0xf])(in_RDX,"\n-- before runAllPostTestAction: ");
  (**(code **)(*in_RSI + 0x30))(in_RSI,in_RDI,in_RDX);
  (*in_RDX->_vptr_TestResult[0xf])(in_RDX,"\n-- after runAllPostTestAction: ");
  return;
}

Assistant:

void UtestShell::runOneTestInCurrentProcess(TestPlugin* plugin, TestResult& result)
{
    result.printVeryVerbose("\n-- before runAllPreTestAction: ");
    plugin->runAllPreTestAction(*this, result);
    result.printVeryVerbose("\n-- after runAllPreTestAction: ");

    //save test context, so that test class can be tested
    UtestShell* savedTest = UtestShell::getCurrent();
    TestResult* savedResult = UtestShell::getTestResult();

    UtestShell::setTestResult(&result);
    UtestShell::setCurrentTest(this);

    result.printVeryVerbose("\n---- before createTest: ");
    Utest* testToRun = createTest();
    result.printVeryVerbose("\n---- after createTest: ");

    result.printVeryVerbose("\n------ before runTest: ");
    testToRun->run();
    result.printVeryVerbose("\n------ after runTest: ");

    UtestShell::setCurrentTest(savedTest);
    UtestShell::setTestResult(savedResult);

    result.printVeryVerbose("\n---- before destroyTest: ");
    destroyTest(testToRun);
    result.printVeryVerbose("\n---- after destroyTest: ");

    result.printVeryVerbose("\n-- before runAllPostTestAction: ");
    plugin->runAllPostTestAction(*this, result);
    result.printVeryVerbose("\n-- after runAllPostTestAction: ");
}